

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  cmCTest *pcVar2;
  size_type sVar3;
  unsigned_long uVar4;
  cmCTestMemCheckHandler *pcVar5;
  iterator iVar6;
  string *this_00;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pbVar15;
  unsigned_long *puVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonValGrindOutput;
  ostringstream cmCTestLog_msg;
  ostringstream ostr;
  RegularExpression vgABR;
  RegularExpression vgIPW;
  RegularExpression vgUMR5;
  RegularExpression vgUMR4;
  RegularExpression vgUMR3;
  RegularExpression vgUMR2;
  RegularExpression vgUMR1;
  RegularExpression vgUMC;
  RegularExpression vgMPK2;
  RegularExpression vgMPK1;
  RegularExpression vgPAR;
  RegularExpression vgMLK2;
  RegularExpression vgMLK1;
  RegularExpression vgFMM;
  RegularExpression vgFIM;
  RegularExpression valgrindLine;
  unsigned_long local_10a8;
  cmDuration local_10a0 [2];
  long local_1090 [2];
  cmCTestMemCheckHandler *local_1080;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1078;
  ulong local_1060;
  unsigned_long *local_1058;
  iterator iStack_1050;
  unsigned_long *local_1048;
  string *local_1038;
  long local_1030;
  vector<int,_std::allocator<int>_> *local_1028;
  undefined1 local_1020 [16];
  _func_int *local_1010 [12];
  ios_base local_fb0 [264];
  undefined1 local_ea8 [376];
  RegularExpression local_d30;
  RegularExpression local_c60;
  RegularExpression local_b90;
  RegularExpression local_ac0;
  RegularExpression local_9f0;
  RegularExpression local_920;
  RegularExpression local_850;
  RegularExpression local_780;
  RegularExpression local_6b0;
  RegularExpression local_5e0;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1028 = results;
  cmsys::SystemTools::Split(str,&local_1078);
  lVar10 = std::__cxx11::string::find((char *)str,0x7f0c1b,0);
  iVar9 = (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ea8);
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  cmsys::RegularExpression::compile(&local_100,"^==[0-9][0-9]*==");
  local_1d0.regmust = (char *)0x0;
  local_1d0.program = (char *)0x0;
  local_1d0.progsize = 0;
  memset(&local_1d0,0,0xaa);
  cmsys::RegularExpression::compile(&local_1d0,"== .*Invalid free\\(\\) / delete / delete\\[\\]");
  local_2a0.regmust = (char *)0x0;
  local_2a0.program = (char *)0x0;
  local_2a0.progsize = 0;
  memset(&local_2a0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_2a0,"== .*Mismatched free\\(\\) / delete / delete \\[\\]");
  local_370.regmust = (char *)0x0;
  local_370.program = (char *)0x0;
  local_370.progsize = 0;
  memset(&local_370,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_370,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  local_440.regmust = (char *)0x0;
  local_440.program = (char *)0x0;
  local_440.progsize = 0;
  memset(&local_440,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_440,
             "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\) bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  local_510.regmust = (char *)0x0;
  local_510.program = (char *)0x0;
  local_510.progsize = 0;
  memset(&local_510,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_510,"== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  local_5e0.regmust = (char *)0x0;
  local_5e0.program = (char *)0x0;
  local_5e0.progsize = 0;
  memset(&local_5e0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_5e0,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in loss record [0-9,]+ of [0-9,]+"
            );
  local_6b0.regmust = (char *)0x0;
  local_6b0.program = (char *)0x0;
  local_6b0.progsize = 0;
  memset(&local_6b0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_6b0,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable in loss record [0-9,]+ of [0-9,]+"
            );
  local_780.regmust = (char *)0x0;
  local_780.program = (char *)0x0;
  local_780.progsize = 0;
  memset(&local_780,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_780,"== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  local_850.regmust = (char *)0x0;
  local_850.program = (char *)0x0;
  local_850.progsize = 0;
  memset(&local_850,0,0xaa);
  cmsys::RegularExpression::compile(&local_850,"== .*Use of uninitialised value of size [0-9,]+");
  local_920.regmust = (char *)0x0;
  local_920.program = (char *)0x0;
  local_920.progsize = 0;
  memset(&local_920,0,0xaa);
  cmsys::RegularExpression::compile(&local_920,"== .*Invalid read of size [0-9,]+");
  local_9f0.regmust = (char *)0x0;
  local_9f0.program = (char *)0x0;
  local_9f0.progsize = 0;
  memset(&local_9f0,0,0xaa);
  cmsys::RegularExpression::compile(&local_9f0,"== .*Jump to the invalid address ");
  local_ac0.regmust = (char *)0x0;
  local_ac0.program = (char *)0x0;
  local_ac0.progsize = 0;
  memset(&local_ac0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_ac0,"== .*Syscall param .* contains uninitialised or unaddressable byte\\(s\\)")
  ;
  local_b90.regmust = (char *)0x0;
  local_b90.program = (char *)0x0;
  local_b90.progsize = 0;
  memset(&local_b90,0,0xaa);
  cmsys::RegularExpression::compile(&local_b90,"== .*Syscall param .* uninitialised");
  local_c60.regmust = (char *)0x0;
  local_c60.program = (char *)0x0;
  local_c60.progsize = 0;
  memset(&local_c60,0,0xaa);
  cmsys::RegularExpression::compile(&local_c60,"== .*Invalid write of size [0-9,]+");
  local_d30.regmust = (char *)0x0;
  local_d30.program = (char *)0x0;
  local_d30.progsize = 0;
  memset(&local_d30,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_d30,"== .*pthread_mutex_unlock: mutex is locked by a different thread");
  local_1058 = (unsigned_long *)0x0;
  iStack_1050._M_current = (unsigned_long *)0x0;
  local_1048 = (unsigned_long *)0x0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1020);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1020,"Start test: ",0xc);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1020);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  local_1030 = lVar11;
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x3d3,(char *)local_10a0[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((long *)local_10a0[0].__r != local_1090) {
    operator_delete((void *)local_10a0[0].__r,local_1090[0] + 1);
  }
  local_1038 = log;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1020);
  std::ios_base::~ios_base(local_fb0);
  local_10a8 = 0;
  local_1080 = this;
  if (local_1078.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_1078.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1060 = 0;
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    local_1060 = 0;
    do {
      pcVar5 = local_1080;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1020);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1020,"test line ",10);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1020,
                           local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_dataplus._M_p,
                           local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar2 = (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x3d7,(char *)local_10a0[0].__r,
                   (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      if ((long *)local_10a0[0].__r != local_1090) {
        operator_delete((void *)local_10a0[0].__r,local_1090[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1020);
      std::ios_base::~ios_base(local_fb0);
      bVar7 = cmsys::RegularExpression::find
                        (&local_100,
                         local_1078.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_dataplus._M_p,
                         &local_100.regmatch);
      if (bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1020);
        pcVar5 = local_1080;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1020,"valgrind  line ",0xf);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1020,
                             local_1078.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_dataplus._M_p,
                             local_1078.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_string_length)
        ;
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar2 = (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x3dc,(char *)local_10a0[0].__r,
                     (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((long *)local_10a0[0].__r != local_1090) {
          operator_delete((void *)local_10a0[0].__r,local_1090[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1020);
        std::ios_base::~ios_base(local_fb0);
        pbVar15 = local_1078.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = local_10a8;
        bVar7 = cmsys::RegularExpression::find
                          (&local_1d0,
                           local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_dataplus._M_p,
                           &local_1d0.regmatch);
        if (bVar7) {
          lVar11 = 6;
LAB_0057aa76:
          bVar7 = false;
        }
        else {
          pbVar15 = pbVar15 + uVar4;
          bVar7 = cmsys::RegularExpression::find
                            (&local_2a0,(pbVar15->_M_dataplus)._M_p,&local_2a0.regmatch);
          if (bVar7) {
            lVar11 = 7;
            goto LAB_0057aa76;
          }
          bVar7 = cmsys::RegularExpression::find
                            (&local_370,(pbVar15->_M_dataplus)._M_p,&local_370.regmatch);
          lVar11 = 0xe;
          if ((bVar7) ||
             (bVar7 = cmsys::RegularExpression::find
                                (&local_440,(pbVar15->_M_dataplus)._M_p,&local_440.regmatch), bVar7)
             ) goto LAB_0057aa76;
          bVar7 = cmsys::RegularExpression::find
                            (&local_510,(pbVar15->_M_dataplus)._M_p,&local_510.regmatch);
          if (bVar7) {
            lVar11 = 0x12;
            goto LAB_0057aa76;
          }
          bVar7 = cmsys::RegularExpression::find
                            (&local_5e0,(pbVar15->_M_dataplus)._M_p,&local_5e0.regmatch);
          lVar11 = 0xf;
          if ((bVar7) ||
             (bVar7 = cmsys::RegularExpression::find
                                (&local_6b0,(pbVar15->_M_dataplus)._M_p,&local_6b0.regmatch), bVar7)
             ) goto LAB_0057aa76;
          bVar7 = cmsys::RegularExpression::find
                            (&local_780,(pbVar15->_M_dataplus)._M_p,&local_780.regmatch);
          if (bVar7) {
            lVar11 = 0x14;
            goto LAB_0057aa76;
          }
          bVar7 = cmsys::RegularExpression::find
                            (&local_850,(pbVar15->_M_dataplus)._M_p,&local_850.regmatch);
          lVar11 = 0x15;
          if ((((bVar7) ||
               (bVar7 = cmsys::RegularExpression::find
                                  (&local_920,(pbVar15->_M_dataplus)._M_p,&local_920.regmatch),
               bVar7)) ||
              (bVar7 = cmsys::RegularExpression::find
                                 (&local_9f0,(pbVar15->_M_dataplus)._M_p,&local_9f0.regmatch), bVar7
              )) || ((bVar7 = cmsys::RegularExpression::find
                                        (&local_ac0,(pbVar15->_M_dataplus)._M_p,&local_ac0.regmatch)
                     , bVar7 ||
                     (bVar7 = cmsys::RegularExpression::find
                                        (&local_b90,(pbVar15->_M_dataplus)._M_p,&local_b90.regmatch)
                     , bVar7)))) goto LAB_0057aa76;
          bVar7 = cmsys::RegularExpression::find
                            (&local_c60,(pbVar15->_M_dataplus)._M_p,&local_c60.regmatch);
          if (bVar7) {
            lVar11 = 0xc;
            goto LAB_0057aa76;
          }
          bVar8 = cmsys::RegularExpression::find
                            (&local_d30,(pbVar15->_M_dataplus)._M_p,&local_d30.regmatch);
          bVar7 = !bVar8;
          lVar11 = 0x16;
          if (bVar8) {
            lVar11 = 0;
          }
        }
        if (!bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_ea8,"<b>",3);
          pbVar15 = (local_1080->ResultStrings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (ulong)(uint)((int)lVar11 << 5);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_ea8,
                               *(char **)((long)&(pbVar15->_M_dataplus)._M_p + uVar13),
                               *(long *)((long)&pbVar15->_M_string_length + uVar13));
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"</b> ",5);
          piVar1 = (local_1028->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar11;
          *piVar1 = *piVar1 + 1;
          local_1060 = (ulong)((int)local_1060 + 1);
        }
        sVar3 = local_1078.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_string_length;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_ea8,
                             local_1078.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_10a8]._M_dataplus._M_p,
                             sVar3);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        uVar14 = uVar14 + sVar3;
      }
      else if (iStack_1050._M_current == local_1048) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1058,iStack_1050,
                   &local_10a8);
      }
      else {
        *iStack_1050._M_current = local_10a8;
        iStack_1050._M_current = iStack_1050._M_current + 1;
      }
      local_10a8 = local_10a8 + 1;
    } while (local_10a8 <
             (ulong)((long)local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  iVar6._M_current = iStack_1050._M_current;
  if (local_1058 != iStack_1050._M_current) {
    puVar16 = local_1058;
    do {
      sVar3 = local_1078.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*puVar16]._M_string_length;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_ea8,
                           local_1078.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[*puVar16]._M_dataplus._M_p,
                           sVar3);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      uVar14 = uVar14 + sVar3;
      if ((ulong)(long)(local_1080->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize <
          uVar14 && (lVar10 == -1 && iVar9 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_ea8,"....\n",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_ea8,
                   "Test Output for this test has been truncated see testing machine logs for full output,\n"
                   ,0x57);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_ea8,
                   "or put CTEST_FULL_OUTPUT in the output of this test program.\n",0x3d);
        break;
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != iVar6._M_current);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1020);
  pcVar5 = local_1080;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1020,"End test (elapsed: ",0x13);
  lVar10 = local_1030;
  this_00 = local_1038;
  lVar11 = std::chrono::_V2::steady_clock::now();
  local_10a0[0].__r = (double)(lVar11 - lVar10) / 1000000000.0;
  cmDurationTo<unsigned_int>(local_10a0);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1020);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"s)",2);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pcVar2 = (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x415,(char *)local_10a0[0].__r,
               (pcVar5->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((long *)local_10a0[0].__r != local_1090) {
    operator_delete((void *)local_10a0[0].__r,local_1090[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1020);
  std::ios_base::~ios_base(local_fb0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this_00,(string *)local_1020);
  if ((_func_int **)local_1020._0_8_ != local_1010) {
    operator_delete((void *)local_1020._0_8_,(ulong)(local_1010[0] + 1));
  }
  iVar9 = (int)local_1060;
  pcVar5->DefectCount = pcVar5->DefectCount + iVar9;
  if (local_1058 != (unsigned_long *)0x0) {
    operator_delete(local_1058,(long)local_1048 - (long)local_1058);
  }
  if (local_d30.program != (char *)0x0) {
    operator_delete__(local_d30.program);
  }
  if (local_c60.program != (char *)0x0) {
    operator_delete__(local_c60.program);
  }
  if (local_b90.program != (char *)0x0) {
    operator_delete__(local_b90.program);
  }
  if (local_ac0.program != (char *)0x0) {
    operator_delete__(local_ac0.program);
  }
  if (local_9f0.program != (char *)0x0) {
    operator_delete__(local_9f0.program);
  }
  if (local_920.program != (char *)0x0) {
    operator_delete__(local_920.program);
  }
  if (local_850.program != (char *)0x0) {
    operator_delete__(local_850.program);
  }
  if (local_780.program != (char *)0x0) {
    operator_delete__(local_780.program);
  }
  if (local_6b0.program != (char *)0x0) {
    operator_delete__(local_6b0.program);
  }
  if (local_5e0.program != (char *)0x0) {
    operator_delete__(local_5e0.program);
  }
  if (local_510.program != (char *)0x0) {
    operator_delete__(local_510.program);
  }
  if (local_440.program != (char *)0x0) {
    operator_delete__(local_440.program);
  }
  if (local_370.program != (char *)0x0) {
    operator_delete__(local_370.program);
  }
  if (local_2a0.program != (char *)0x0) {
    operator_delete__(local_2a0.program);
  }
  if (local_1d0.program != (char *)0x0) {
    operator_delete__(local_1d0.program);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ea8);
  std::ios_base::~ios_base((ios_base *)(local_ea8 + 0x70));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1078);
  return iVar9 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression valgrindLine("^==[0-9][0-9]*==");

  cmsys::RegularExpression vgFIM(
    R"(== .*Invalid free\(\) / delete / delete\[\])");
  cmsys::RegularExpression vgFMM(
    R"(== .*Mismatched free\(\) / delete / delete \[\])");
  cmsys::RegularExpression vgMLK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMLK2(
    "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\)"
    " bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgPAR(
    "== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgMPK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in"
    " loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMPK2(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgUMC(
    "== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  cmsys::RegularExpression vgUMR1(
    "== .*Use of uninitialised value of size [0-9,]+");
  cmsys::RegularExpression vgUMR2("== .*Invalid read of size [0-9,]+");
  cmsys::RegularExpression vgUMR3("== .*Jump to the invalid address ");
  cmsys::RegularExpression vgUMR4(
    "== .*Syscall param .* contains "
    "uninitialised or unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgUMR5("== .*Syscall param .* uninitialised");
  cmsys::RegularExpression vgIPW("== .*Invalid write of size [0-9,]+");
  cmsys::RegularExpression vgABR("== .*pthread_mutex_unlock: mutex is "
                                 "locked by a different thread");
  std::vector<std::string::size_type> nonValGrindOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (valgrindLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "valgrind  line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = cmCTestMemCheckHandler::NO_MEMORY_FAULT;
      auto& line = lines[cc];
      if (vgFIM.find(line)) {
        failure = cmCTestMemCheckHandler::FIM;
      } else if (vgFMM.find(line)) {
        failure = cmCTestMemCheckHandler::FMM;
      } else if (vgMLK1.find(line) || vgMLK2.find(line)) {
        failure = cmCTestMemCheckHandler::MLK;
      } else if (vgPAR.find(line)) {
        failure = cmCTestMemCheckHandler::PAR;
      } else if (vgMPK1.find(line) || vgMPK2.find(line)) {
        failure = cmCTestMemCheckHandler::MPK;
      } else if (vgUMC.find(line)) {
        failure = cmCTestMemCheckHandler::UMC;
      } else if (vgUMR1.find(line) || vgUMR2.find(line) || vgUMR3.find(line) ||
                 vgUMR4.find(line) || vgUMR5.find(line)) {
        failure = cmCTestMemCheckHandler::UMR;
      } else if (vgIPW.find(line)) {
        failure = cmCTestMemCheckHandler::IPW;
      } else if (vgABR.find(line)) {
        failure = cmCTestMemCheckHandler::ABR;
      }

      if (failure != cmCTestMemCheckHandler::NO_MEMORY_FAULT) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        results[failure]++;
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonValGrindOutput.push_back(cc);
    }
  }
  // Now put all all the non valgrind output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonValGrindOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}